

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_line.cpp
# Opt level: O1

void arrow_line_y_init(Am_Slot *slot,Am_Web_Init *init)

{
  Am_Object_Advanced obj;
  Am_Object AStack_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Slot::Get_Owner((Am_Slot *)&AStack_68);
  Am_Object::Am_Object(&local_18,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_18,0x8c);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Am_Object(&local_20,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_20,0x8e);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object(&local_28,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_28,0x65);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_30,0x67);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_38,0x6b);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Am_Object(&local_40,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_40,0x90);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&local_48,&AStack_68);
  Am_Web_Init::Note_Input(init,(Am_Object_Advanced *)&local_48,0x91);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_50,0x8e);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_58,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_58,0x65);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object(&local_60,&AStack_68);
  Am_Web_Init::Note_Output(init,(Am_Object_Advanced *)&local_60,0x67);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&AStack_68);
  return;
}

Assistant:

static void
arrow_line_y_init(const Am_Slot &slot, Am_Web_Init &init)
{
  Am_Object_Advanced obj = slot.Get_Owner();
  init.Note_Input(obj, Am_Y1);
  init.Note_Input(obj, Am_Y2);
  init.Note_Input(obj, Am_TOP);
  init.Note_Input(obj, Am_HEIGHT);
  init.Note_Input(obj, Am_LINE_STYLE);
  init.Note_Input(obj, Am_HEAD_LENGTH);
  init.Note_Input(obj, Am_HEAD_WIDTH);
  init.Note_Output(obj, Am_Y2);
  init.Note_Output(obj, Am_TOP);
  init.Note_Output(obj, Am_HEIGHT);
}